

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::BlockConnected
          (PeerManagerImpl *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  long lVar1;
  element_type *peVar2;
  pointer psVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  CRollingBloomFilter *pCVar6;
  duration<long,_std::ratio<1L,_1L>_> *__e;
  element_type *peVar7;
  shared_ptr<const_CTransaction> *ptx;
  pointer psVar8;
  duration<long,_std::ratio<1L,_1L>_> __i;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  duration<long,_std::ratio<1L,_1L>_> stalling_timeout;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  LOCK();
  (this->m_last_tip_update)._M_i.__r = (rep)tVar5.__d.__r;
  UNLOCK();
  stalling_timeout.__r = (this->m_block_stalling_timeout)._M_i.__r;
  if (stalling_timeout.__r != 2) {
    __i.__r = 2;
    if (2 < (long)((double)stalling_timeout.__r * 0.85)) {
      __i.__r = (long)((double)stalling_timeout.__r * 0.85);
    }
    __e = &stalling_timeout;
    bVar4 = std::atomic<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::compare_exchange_strong
                      (&this->m_block_stalling_timeout,__e,__i,seq_cst);
    if (bVar4) {
      bVar4 = ::LogAcceptCategory(NET,(Level)__e);
      if (bVar4) {
        logging_function._M_str = "BlockConnected";
        logging_function._M_len = 0xe;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        criticalblock40.super_unique_lock._M_device = (mutex_type *)__i.__r;
        LogPrintf_<long>(logging_function,source_file,0x86b,NET,Debug,
                         "Decreased stalling timeout to %d seconds\n",(long *)&criticalblock40);
      }
    }
  }
  if (role != BACKGROUND) {
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock40,&this->m_tx_download_mutex,"m_tx_download_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0x874,false);
    TxOrphanage::EraseForBlock
              (&this->m_orphanage,
               (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    peVar2 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar3 = (peVar2->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar8 = (peVar2->vtx).
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar3; psVar8 = psVar8 + 1)
    {
      pCVar6 = RecentConfirmedTransactionsFilter(this);
      vKey.m_data = &((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash;
      vKey.m_size = 0x20;
      CRollingBloomFilter::insert(pCVar6,vKey);
      peVar7 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar7->m_has_witness == true) {
        pCVar6 = RecentConfirmedTransactionsFilter(this);
        vKey_00.m_data =
             &((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->m_witness_hash;
        vKey_00.m_size = 0x20;
        CRollingBloomFilter::insert(pCVar6,vKey_00);
        peVar7 = (psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
      }
      TxRequestTracker::ForgetTxHash(&this->m_txrequest,&(peVar7->hash).m_wrapped);
      TxRequestTracker::ForgetTxHash
                (&this->m_txrequest,
                 &(((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->m_witness_hash).m_wrapped);
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock40.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockConnected(
    ChainstateRole role,
    const std::shared_ptr<const CBlock>& pblock,
    const CBlockIndex* pindex)
{
    // Update this for all chainstate roles so that we don't mistakenly see peers
    // helping us do background IBD as having a stale tip.
    m_last_tip_update = GetTime<std::chrono::seconds>();

    // In case the dynamic timeout was doubled once or more, reduce it slowly back to its default value
    auto stalling_timeout = m_block_stalling_timeout.load();
    Assume(stalling_timeout >= BLOCK_STALLING_TIMEOUT_DEFAULT);
    if (stalling_timeout != BLOCK_STALLING_TIMEOUT_DEFAULT) {
        const auto new_timeout = std::max(std::chrono::duration_cast<std::chrono::seconds>(stalling_timeout * 0.85), BLOCK_STALLING_TIMEOUT_DEFAULT);
        if (m_block_stalling_timeout.compare_exchange_strong(stalling_timeout, new_timeout)) {
            LogDebug(BCLog::NET, "Decreased stalling timeout to %d seconds\n", count_seconds(new_timeout));
        }
    }

    // The following task can be skipped since we don't maintain a mempool for
    // the ibd/background chainstate.
    if (role == ChainstateRole::BACKGROUND) {
        return;
    }
    LOCK(m_tx_download_mutex);
    m_orphanage.EraseForBlock(*pblock);

    for (const auto& ptx : pblock->vtx) {
        RecentConfirmedTransactionsFilter().insert(ptx->GetHash().ToUint256());
        if (ptx->HasWitness()) {
            RecentConfirmedTransactionsFilter().insert(ptx->GetWitnessHash().ToUint256());
        }
        m_txrequest.ForgetTxHash(ptx->GetHash());
        m_txrequest.ForgetTxHash(ptx->GetWitnessHash());
    }
}